

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::iterateShaders
               (NegativeTestContext *ctx,TestCase testCase)

{
  ShaderType shaderType;
  RenderContext *renderCtx;
  NegativeTestContext *this;
  bool bVar1;
  long *plVar2;
  char *pcVar3;
  size_t sVar4;
  MessageBuilder *pMVar5;
  TestLog *pTVar6;
  long lVar7;
  long lVar8;
  GLint maxBuffers;
  ShaderProgram program;
  undefined1 auStack_3b8 [4];
  TestCase local_3b4;
  NegativeTestContext *local_3b0;
  GLint local_3a4;
  TestLog *local_3a0;
  long *local_398;
  long local_390;
  long local_388 [2];
  ShaderType local_378;
  value_type local_370;
  undefined1 local_350 [8];
  _func_int **local_348;
  TestLog local_340;
  long lStack_338;
  ios_base local_2e0 [8];
  ios_base local_2d8 [264];
  ShaderProgram local_1d0;
  ProgramSources local_100;
  
  local_3a0 = (ctx->super_CallLogWrapper).m_log;
  lVar8 = 0;
  local_3b4 = testCase;
  local_3b0 = ctx;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar8];
    bVar1 = NegativeTestContext::isShaderSupported(local_3b0,shaderType);
    if (!bVar1) goto LAB_01617cbc;
    local_1d0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)&local_1d0.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Verify shader: ","");
    glu::getShaderTypeName(shaderType);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    local_350 = (undefined1  [8])&local_340;
    pTVar6 = (TestLog *)(plVar2 + 2);
    if ((TestLog *)*plVar2 == pTVar6) {
      local_340.m_log = pTVar6->m_log;
      lStack_338 = plVar2[3];
    }
    else {
      local_340.m_log = pTVar6->m_log;
      local_350 = (undefined1  [8])*plVar2;
    }
    local_348 = (_func_int **)plVar2[1];
    *plVar2 = (long)pTVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    NegativeTestContext::beginSection(local_3b0,(string *)local_350);
    if (local_350 != (undefined1  [8])&local_340) {
      operator_delete((void *)local_350,(ulong)((long)&(local_340.m_log)->flags + 1));
    }
    if (local_1d0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_1d0.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_1d0.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    this = local_3b0;
    renderCtx = local_3b0->m_renderCtx;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&local_100,0,0xac);
    local_3a4 = -1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
    glu::CallLogWrapper::glGetIntegerv(&this->super_CallLogWrapper,0x92dc,&local_3a4);
    pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)auStack_3b8 + (int)((TestLog *)((long)local_350 + -0x18))->m_log + 0x68);
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,pcVar3,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"\n",1);
    lVar7 = 0x2f;
    pcVar3 = "#extension GL_EXT_tessellation_shader : enable\n";
    if (shaderType - SHADERTYPE_TESSELLATION_CONTROL < 2) {
LAB_016178cd:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,pcVar3,lVar7);
    }
    else if (shaderType == SHADERTYPE_GEOMETRY) {
      lVar7 = 0x1e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_350,"#extension GL_EXT_geometry_shader : enable\n",0x2b);
      pcVar3 = "layout(max_vertices = 3) out;\n";
      goto LAB_016178cd;
    }
    lVar7 = 0x32;
    pMVar5 = (MessageBuilder *)local_350;
    switch(local_3b4) {
    case TESTCASE_LAYOUT_LARGE_BINDING:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_350,"layout (binding = ",0x12);
      pMVar5 = (MessageBuilder *)std::ostream::operator<<((MessageBuilder *)local_350,local_3a4);
      lVar7 = 0x2c;
      pcVar3 = ", offset = 0) uniform atomic_uint counter0;\n";
      break;
    case TESTCASE_LAYOUT_MEDIUMP_PRECISION:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_350,"layout (binding = 1, offset = 0) ",0x21);
      pcVar3 = glu::getPrecisionName(PRECISION_MEDIUMP);
      goto LAB_016179a5;
    case TESTCASE_LAYOUT_LOWP_PRECISION:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_350,"layout (binding = 1, offset = 0) ",0x21);
      pcVar3 = glu::getPrecisionName(PRECISION_LOWP);
LAB_016179a5:
      if (pcVar3 == (char *)0x0) {
        lVar7 = 0x1f;
        std::ios::clear((int)auStack_3b8 + (int)((TestLog *)((long)local_350 + -0x18))->m_log + 0x68
                       );
        pcVar3 = " uniform atomic_uint counter0;\n";
      }
      else {
        sVar4 = strlen(pcVar3);
        lVar7 = 0x1f;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,pcVar3,sVar4);
        pcVar3 = " uniform atomic_uint counter0;\n";
      }
      break;
    case TESTCASE_LAYOUT_BINDING_OFFSET_OVERLAP:
      lVar7 = 0x3f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_350,
                 "layout (binding = 1, offset = 0) uniform atomic_uint counter0;\n",0x3f);
      pcVar3 = "layout (binding = 1, offset = 2) uniform atomic_uint counter1;\n";
      break;
    case TESTCASE_LAYOUT_BINDING_OMITTED:
      pcVar3 = "layout (offset = 0) uniform atomic_uint counter0;\n";
      break;
    case TESTCASE_STRUCT:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"struct\n",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"  int a;\n",9);
      lVar7 = 5;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_350,"  atomic_uint counter;\n",0x17);
      pcVar3 = "} S;\n";
      break;
    case TESTCASE_BODY_WRITE:
      pcVar3 = "layout (binding = 1) uniform atomic_uint counter;\n";
      break;
    default:
      goto switchD_016178fb_default;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pMVar5,pcVar3,lVar7);
switchD_016178fb_default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"{\n",2);
    if (local_3b4 == TESTCASE_BODY_WRITE) {
      lVar7 = 0xd;
      pcVar3 = "counter = 1;\n";
LAB_01617ace:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,pcVar3,lVar7);
    }
    else if (local_3b4 == TESTCASE_BODY_DECLARE) {
      lVar7 = 0x15;
      pcVar3 = "atomic_uint counter;\n";
      goto LAB_01617ace;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_350);
    std::ios_base::~ios_base(local_2e0);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    local_378 = shaderType;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_398,local_390 + (long)local_398);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + local_378,&local_370);
    glu::ShaderProgram::ShaderProgram(&local_1d0,renderCtx,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_398 != local_388) {
      operator_delete(local_398,local_388[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar7 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar7));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
    if (*(bool *)((long)&(*local_1d0.m_shaders[shaderType].
                           super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
                           .super__Vector_impl_data._M_start)->m_info + 0x48) == true) {
      glu::operator<<(local_3a0,&local_1d0);
      local_350 = (undefined1  [8])local_3a0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_348,"Expected program to fail, but compilation passed.",0x31);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_350,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_348);
      std::ios_base::~ios_base(local_2d8);
      local_350 = (undefined1  [8])&local_340;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_350,"Shader was not expected to compile.","");
      NegativeTestContext::fail(local_3b0,(string *)local_350);
      if (local_350 != (undefined1  [8])&local_340) {
        operator_delete((void *)local_350,(ulong)((long)&(local_340.m_log)->flags + 1));
      }
    }
    NegativeTestContext::endSection(local_3b0);
    glu::ShaderProgram::~ShaderProgram(&local_1d0);
LAB_01617cbc:
    lVar8 = lVar8 + 1;
    if (lVar8 == 6) {
      return;
    }
  } while( true );
}

Assistant:

void iterateShaders (NegativeTestContext& ctx, TestCase testCase)
{
	tcu::TestLog& log = ctx.getLog();
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaders); ndx++)
	{
		if (ctx.isShaderSupported(s_shaders[ndx]))
		{
			ctx.beginSection(std::string("Verify shader: ") + glu::getShaderTypeName(s_shaders[ndx]));
			const glu::ShaderProgram program(ctx.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(s_shaders[ndx], genShaderSource(ctx, testCase, s_shaders[ndx])));
			if (program.getShaderInfo(s_shaders[ndx]).compileOk)
			{
				log << program;
				log << tcu::TestLog::Message << "Expected program to fail, but compilation passed." << tcu::TestLog::EndMessage;
				ctx.fail("Shader was not expected to compile.");
			}
			ctx.endSection();
		}
	}
}